

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O1

void __thiscall
FilmGrainTableTest_AddAndLookupSingleSegment_Test::TestBody
          (FilmGrainTableTest_AddAndLookupSingleSegment_Test *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  pointer *__ptr;
  SEARCH_METHODS *pSVar6;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  aom_film_grain_table_t table;
  aom_film_grain_t grain;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e0;
  undefined8 *local_2d8;
  AssertHelper local_2d0;
  string local_2c8;
  aom_film_grain_table_t local_2a8;
  aom_film_grain_t local_290;
  
  local_2a8.head = (aom_film_grain_table_entry_t *)0x0;
  local_2a8.tail = (aom_film_grain_table_entry_t *)0x0;
  iVar3 = aom_film_grain_table_lookup(&local_2a8,0,1000,0,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 == 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 0, 1000, false, &grain)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x55,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  aom_film_grain_table_append(&local_2a8,1000,2000,film_grain_test_vectors);
  iVar3 = aom_film_grain_table_lookup(&local_2a8,0,1000,0,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 == 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 0, 1000, false, &grain)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x58,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,2000,3000,0,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 == 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 2000, 3000, false, &grain)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x59,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,1000,2000,0,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 != 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 1000, 2000, false, &grain)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x5b,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  local_290.bit_depth = film_grain_test_vectors[0].bit_depth;
  local_2e0._M_head_impl = local_2e0._M_head_impl & 0xffffffff00000000;
  uVar4 = (ulong)local_290._0_8_ >> 0x38 | (local_290._0_8_ & 0xff000000000000) >> 0x28 |
          (local_290._0_8_ & 0xff0000000000) >> 0x18 | (local_290._0_8_ & 0xff00000000) >> 8 |
          (local_290._0_8_ & 0xff000000) << 8 | (local_290._0_8_ & 0xff0000) << 0x18 |
          (local_290._0_8_ & 0xff00) << 0x28 | local_290._0_8_ << 0x38;
  uVar5 = (ulong)film_grain_test_vectors[0]._0_8_ >> 0x38 |
          (film_grain_test_vectors[0]._0_8_ & 0xff000000000000) >> 0x28 |
          (film_grain_test_vectors[0]._0_8_ & 0xff0000000000) >> 0x18 |
          (film_grain_test_vectors[0]._0_8_ & 0xff00000000) >> 8 |
          (film_grain_test_vectors[0]._0_8_ & 0xff000000) << 8 |
          (film_grain_test_vectors[0]._0_8_ & 0xff0000) << 0x18 |
          (film_grain_test_vectors[0]._0_8_ & 0xff00) << 0x28 |
          film_grain_test_vectors[0]._0_8_ << 0x38;
  if (uVar4 == uVar5) {
    uVar4 = (ulong)local_290.scaling_points_y[0] >> 0x38 |
            ((ulong)local_290.scaling_points_y[0] & 0xff000000000000) >> 0x28 |
            ((ulong)local_290.scaling_points_y[0] & 0xff0000000000) >> 0x18 |
            ((ulong)local_290.scaling_points_y[0] & 0xff00000000) >> 8 |
            ((ulong)local_290.scaling_points_y[0] & 0xff000000) << 8 |
            ((ulong)local_290.scaling_points_y[0] & 0xff0000) << 0x18 |
            ((ulong)local_290.scaling_points_y[0] & 0xff00) << 0x28 |
            (long)local_290.scaling_points_y[0] << 0x38;
    uVar5 = (ulong)film_grain_test_vectors[0].scaling_points_y[0] >> 0x38 |
            ((ulong)film_grain_test_vectors[0].scaling_points_y[0] & 0xff000000000000) >> 0x28 |
            ((ulong)film_grain_test_vectors[0].scaling_points_y[0] & 0xff0000000000) >> 0x18 |
            ((ulong)film_grain_test_vectors[0].scaling_points_y[0] & 0xff00000000) >> 8 |
            ((ulong)film_grain_test_vectors[0].scaling_points_y[0] & 0xff000000) << 8 |
            ((ulong)film_grain_test_vectors[0].scaling_points_y[0] & 0xff0000) << 0x18 |
            ((ulong)film_grain_test_vectors[0].scaling_points_y[0] & 0xff00) << 0x28 |
            (long)film_grain_test_vectors[0].scaling_points_y[0] << 0x38;
    local_2e8._M_head_impl._0_4_ = 0;
    if (uVar4 == uVar5) goto LAB_004e84b7;
  }
  local_2e8._M_head_impl._0_4_ = -(uint)(uVar4 < uVar5) | 1;
LAB_004e84b7:
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_2c8,"0","memcmp(&grain, film_grain_test_vectors + 0, sizeof(table))"
             ,(int *)&local_2e0,(int *)&local_2e8);
  if ((char)local_2c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2c8._M_string_length == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_2c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x5e,(char *)pSVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2c8._M_string_length;
  if ((undefined8 *)local_2c8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2c8._M_string_length !=
        (undefined8 *)(local_2c8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2c8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  aom_film_grain_table_append(&local_2a8,2000,3000,film_grain_test_vectors);
  local_2e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_2a8.head)->next;
  local_2e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<aom_film_grain_table_entry_t*,aom_film_grain_table_entry_t*>
            ((internal *)&local_2c8,"nullptr","table.head->next",
             (aom_film_grain_table_entry_t **)&local_2e8,(aom_film_grain_table_entry_t **)&local_2e0
            );
  if ((char)local_2c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2c8._M_string_length == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_2c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x62,(char *)pSVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((aom_film_grain_table_entry_t *)local_2e0._M_head_impl !=
        (aom_film_grain_table_entry_t *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2c8._M_string_length;
  if ((undefined8 *)local_2c8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2c8._M_string_length !=
        (undefined8 *)(local_2c8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2c8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,1000,2000,1,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 != 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 1000, 2000, true, &grain)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x65,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,1000,2000,0,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 == 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 1000, 2000, false, &grain)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x66,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,2000,3000,1,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 != 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 2000, 3000, true, &grain)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x68,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,2000,3000,0,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 == 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 2000, 3000, false, &grain)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x69,(char *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,
                                      (char)local_2c8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2c8._M_dataplus._M_p._1_7_,(char)local_2c8._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  puVar1 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar1);
  }
  local_2e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8.head;
  local_2e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<aom_film_grain_table_entry_t*,aom_film_grain_table_entry_t*>
            ((internal *)&local_2c8,"nullptr","table.head",
             (aom_film_grain_table_entry_t **)&local_2e8,(aom_film_grain_table_entry_t **)&local_2e0
            );
  if ((char)local_2c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2c8._M_string_length == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_2c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x6b,(char *)pSVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((aom_film_grain_table_entry_t *)local_2e0._M_head_impl !=
        (aom_film_grain_table_entry_t *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2c8._M_string_length;
  if ((undefined8 *)local_2c8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2c8._M_string_length !=
        (undefined8 *)(local_2c8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2c8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_2e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8.tail;
  local_2e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<aom_film_grain_table_entry_t*,aom_film_grain_table_entry_t*>
            ((internal *)&local_2c8,"nullptr","table.tail",
             (aom_film_grain_table_entry_t **)&local_2e8,(aom_film_grain_table_entry_t **)&local_2e0
            );
  if ((char)local_2c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2c8._M_string_length == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_2c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x6c,(char *)pSVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((aom_film_grain_table_entry_t *)local_2e0._M_head_impl !=
        (aom_film_grain_table_entry_t *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  if ((undefined8 *)local_2c8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2c8._M_string_length !=
        (undefined8 *)(local_2c8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2c8._M_string_length);
    }
    operator_delete((void *)local_2c8._M_string_length);
  }
  aom_film_grain_table_free(&local_2a8);
  return;
}

Assistant:

TEST(FilmGrainTableTest, AddAndLookupSingleSegment) {
  aom_film_grain_table_t table;
  memset(&table, 0, sizeof(table));

  aom_film_grain_t grain;
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 0, 1000, false, &grain));

  aom_film_grain_table_append(&table, 1000, 2000, film_grain_test_vectors + 0);
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 0, 1000, false, &grain));
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 2000, 3000, false, &grain));

  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 1000, 2000, false, &grain));

  grain.bit_depth = film_grain_test_vectors[0].bit_depth;
  EXPECT_EQ(0, memcmp(&grain, film_grain_test_vectors + 0, sizeof(table)));

  // Extend the existing segment
  aom_film_grain_table_append(&table, 2000, 3000, film_grain_test_vectors + 0);
  EXPECT_EQ(nullptr, table.head->next);

  // Lookup and remove and check that the entry is no longer there
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 1000, 2000, true, &grain));
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 1000, 2000, false, &grain));

  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 2000, 3000, true, &grain));
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 2000, 3000, false, &grain));

  EXPECT_EQ(nullptr, table.head);
  EXPECT_EQ(nullptr, table.tail);
  aom_film_grain_table_free(&table);
}